

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

Array<capnp::compiler::BrandedDecl> * __thiscall
kj::heapArray<capnp::compiler::BrandedDecl>
          (Array<capnp::compiler::BrandedDecl> *__return_storage_ptr__,kj *this,
          ArrayPtr<capnp::compiler::BrandedDecl> content)

{
  BrandedDecl *pos;
  BrandedDecl *pBVar1;
  Array<capnp::compiler::BrandedDecl> *result;
  
  pos = (BrandedDecl *)
        _::HeapArrayDisposer::allocateImpl
                  (0xa8,0,(size_t)content.ptr,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0)
  ;
  pBVar1 = _::
           CopyConstructArray_<capnp::compiler::BrandedDecl,_capnp::compiler::BrandedDecl_*,_false,_false>
           ::apply(pos,(BrandedDecl *)this,(BrandedDecl *)(this + (long)content.ptr * 0xa8));
  __return_storage_ptr__->ptr = pos;
  __return_storage_ptr__->size_ = ((long)pBVar1 - (long)pos >> 3) * -0x30c30c30c30c30c3;
  __return_storage_ptr__->disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  return __return_storage_ptr__;
}

Assistant:

Array<T> heapArray(ArrayPtr<T> content) {
  ArrayBuilder<T> builder = heapArrayBuilder<T>(content.size());
  builder.addAll(content);
  return builder.finish();
}